

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::Module::GetExtInstImportId(Module *this,char *extstr)

{
  Instruction *this_00;
  int iVar1;
  uint32_t uVar2;
  Operand *this_01;
  string local_50;
  
  this_00 = &(this->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  do {
    this_00 = *(Instruction **)
               ((long)&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8);
    if (this_00 ==
        &(this->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      return 0;
    }
    this_01 = Instruction::GetInOperand(this_00,0);
    Operand::AsString_abi_cxx11_(&local_50,this_01);
    iVar1 = std::__cxx11::string::compare((char *)&local_50);
    std::__cxx11::string::_M_dispose();
  } while (iVar1 != 0);
  uVar2 = Instruction::result_id(this_00);
  return uVar2;
}

Assistant:

uint32_t Module::GetExtInstImportId(const char* extstr) {
  for (auto& ei : ext_inst_imports_)
    if (!ei.GetInOperand(0).AsString().compare(extstr)) return ei.result_id();
  return 0;
}